

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O3

uint8_t __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
tagsOffset(SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint8_t *start)

{
  byte *pbVar1;
  uint8_t uVar2;
  char cVar3;
  byte bVar4;
  
  bVar4 = *start;
  if ((bVar4 & 0xfe) == 0xee) {
    uVar2 = '\0';
    do {
      pbVar1 = start + 9;
      start = start + 2;
      cVar3 = '\x02';
      if (bVar4 != 0xee) {
        start = pbVar1;
        cVar3 = '\t';
      }
      uVar2 = uVar2 + cVar3;
      bVar4 = *start;
    } while ((bVar4 & 0xfe) == 0xee);
    return uVar2;
  }
  return '\0';
}

Assistant:

uint8_t tagsOffset(uint8_t const* start) const noexcept {
    uint8_t ret = 0;

    while (SliceStaticData::TypeMap[*start] == ValueType::Tagged) {
      uint8_t offset = tagOffset(start);
      VELOCYPACK_ASSERT(offset != 0);
      if (VELOCYPACK_UNLIKELY(offset == 0)) {
        // prevent endless loop
        break;
      }
      ret += offset;
      start += offset;
    }

    return ret;
  }